

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_request.cpp
# Opt level: O1

bool __thiscall cppcms::http::request::prepare(request *this)

{
  _data *p_Var1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  undefined4 extraout_var_00;
  request *this_00;
  request *__s;
  
  iVar3 = (*this->conn_->_vptr_connection[0x19])();
  __s = (request *)CONCAT44(extraout_var,iVar3);
  this_00 = __s;
  sVar4 = strlen((char *)__s);
  bVar2 = parse_form_urlencoded
                    (this_00,(char *)__s,&(__s->get_)._M_t._M_impl.field_0x0 + sVar4,&this->get_);
  if (!bVar2) {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)this);
  }
  parse_cookies(this);
  iVar3 = (*this->conn_->_vptr_connection[0x1b])();
  p_Var1 = (this->d).ptr_;
  p_Var1->content_length = CONCAT44(extraout_var_00,iVar3);
  if (CONCAT44(extraout_var_00,iVar3) == 0) {
    p_Var1->ready = true;
  }
  return true;
}

Assistant:

bool request::prepare()
{
	char const *query=conn_->env_query_string();
	if(!parse_form_urlencoded(query,query + strlen(query),get_))  {
		get_.clear();
	}
	parse_cookies();
	d->content_length = conn_->env_content_length();
	if(d->content_length == 0)
		d->ready = true;
	return true;
}